

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::Expand
          (TPZManVector<TPZEqnArray<std::complex<double>_>,_10> *this,int64_t newsize)

{
  TPZEqnArray<std::complex<double>_> *pTVar1;
  undefined1 auVar2 [16];
  int64_t *piVar3;
  ulong uVar4;
  long lVar5;
  int64_t i;
  TPZEqnArray<std::complex<double>_> *pTVar6;
  long lVar7;
  
  if ((10 < newsize) &&
     ((this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc < newsize)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = newsize;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x51d0),8) == 0) {
      uVar4 = SUB168(auVar2 * ZEXT816(0x51d0),0) | 8;
    }
    piVar3 = (int64_t *)operator_new__(uVar4);
    *piVar3 = newsize;
    pTVar1 = (TPZEqnArray<std::complex<double>_> *)(piVar3 + 1);
    lVar5 = 0;
    pTVar6 = pTVar1;
    do {
      TPZEqnArray<std::complex<double>_>::TPZEqnArray(pTVar6);
      lVar5 = lVar5 + -0x51d0;
      pTVar6 = pTVar6 + 1;
    } while (newsize * -0x51d0 - lVar5 != 0);
    lVar5 = 0;
    for (lVar7 = 0; pTVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore,
        lVar7 < (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
        lVar7 = lVar7 + 1) {
      TPZEqnArray<std::complex<double>_>::operator=
                ((TPZEqnArray<std::complex<double>_> *)
                 ((long)(pTVar1->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x28),
                 (TPZEqnArray<std::complex<double>_> *)
                 ((long)(pTVar6->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x28));
      lVar5 = lVar5 + 0x51d0;
    }
    if (pTVar6 != (TPZEqnArray<std::complex<double>_> *)0x0 &&
        pTVar6 != (TPZEqnArray<std::complex<double>_> *)&this->field_0x20) {
      lVar5 = *(long *)&pTVar6[-1].fLastTerm;
      if (lVar5 != 0) {
        lVar7 = lVar5 * 0x51d0;
        do {
          TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                    ((TPZEqnArray<std::complex<double>_> *)
                     ((long)pTVar6[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28));
          lVar7 = lVar7 + -0x51d0;
        } while (lVar7 != 0);
      }
      operator_delete__(&pTVar6[-1].fLastTerm,lVar5 * 0x51d0 | 8);
    }
    (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore = pTVar1;
    (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}